

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpv(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *nulval,void *array,
         int *anynul,int *status)

{
  long in_RCX;
  int in_ESI;
  long in_R8;
  unsigned_long *unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined2 in_stack_0000000c;
  undefined1 in_stack_0000000e;
  uchar in_stack_0000000f;
  undefined4 in_stack_00000030;
  undefined4 local_4;
  
  if ((*array < 1) && (in_RCX != 0)) {
    if (in_ESI == 0xb) {
      if (in_R8 == 0) {
        ffgpvb((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,in_stack_0000000f,
               (uchar *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvb((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,in_stack_0000000f,
               (uchar *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0xc) {
      if (in_R8 == 0) {
        ffgpvsb((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,in_stack_0000000f,
                (char *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvsb((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,in_stack_0000000f,
                (char *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x14) {
      if (in_R8 == 0) {
        ffgpvui((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT11(in_stack_0000000f,in_stack_0000000e),(unsigned_short *)unaff_retaddr,anynul
                ,status);
      }
      else {
        ffgpvui((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT11(in_stack_0000000f,in_stack_0000000e),(unsigned_short *)unaff_retaddr,anynul
                ,status);
      }
    }
    else if (in_ESI == 0x15) {
      if (in_R8 == 0) {
        ffgpvi((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
               CONCAT11(in_stack_0000000f,in_stack_0000000e),(short *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvi((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
               CONCAT11(in_stack_0000000f,in_stack_0000000e),(short *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x1e) {
      if (in_R8 == 0) {
        ffgpvuk((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT13(in_stack_0000000f,CONCAT12(in_stack_0000000e,in_stack_0000000c)),
                (uint *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvuk((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT13(in_stack_0000000f,CONCAT12(in_stack_0000000e,in_stack_0000000c)),
                (uint *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x1f) {
      if (in_R8 == 0) {
        ffgpvk((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
               CONCAT13(in_stack_0000000f,CONCAT12(in_stack_0000000e,in_stack_0000000c)),
               (int *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvk((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
               CONCAT13(in_stack_0000000f,CONCAT12(in_stack_0000000e,in_stack_0000000c)),
               (int *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x28) {
      if (in_R8 == 0) {
        ffgpvuj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT17(in_stack_0000000f,
                         CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
                unaff_retaddr,anynul,status);
      }
      else {
        ffgpvuj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT17(in_stack_0000000f,
                         CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
                unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x29) {
      if (in_R8 == 0) {
        ffgpvj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
               CONCAT17(in_stack_0000000f,
                        CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
               (long *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
               CONCAT17(in_stack_0000000f,
                        CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
               (long *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x50) {
      if (in_R8 == 0) {
        ffgpvujj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                 CONCAT17(in_stack_0000000f,
                          CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008)))
                 ,unaff_retaddr,anynul,status);
      }
      else {
        ffgpvujj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                 CONCAT17(in_stack_0000000f,
                          CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008)))
                 ,unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x51) {
      if (in_R8 == 0) {
        ffgpvjj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT17(in_stack_0000000f,
                         CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
                (LONGLONG *)unaff_retaddr,anynul,status);
      }
      else {
        ffgpvjj((fitsfile *)firstelem,nelem,(LONGLONG)nulval,(LONGLONG)array,
                CONCAT17(in_stack_0000000f,
                         CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
                (LONGLONG *)unaff_retaddr,anynul,status);
      }
    }
    else if (in_ESI == 0x2a) {
      if (in_R8 == 0) {
        ffgpve((fitsfile *)CONCAT44(datatype,in_stack_00000030),firstelem,nelem,(LONGLONG)nulval,
               array._4_4_,
               (float *)CONCAT17(in_stack_0000000f,
                                 CONCAT16(in_stack_0000000e,
                                          CONCAT24(in_stack_0000000c,in_stack_00000008))),
               (int *)unaff_retaddr,anynul);
      }
      else {
        ffgpve((fitsfile *)CONCAT44(datatype,in_stack_00000030),firstelem,nelem,(LONGLONG)nulval,
               array._4_4_,
               (float *)CONCAT17(in_stack_0000000f,
                                 CONCAT16(in_stack_0000000e,
                                          CONCAT24(in_stack_0000000c,in_stack_00000008))),
               (int *)unaff_retaddr,anynul);
      }
    }
    else if (in_ESI == 0x52) {
      if (in_R8 == 0) {
        ffgpvd((fitsfile *)CONCAT44(datatype,in_stack_00000030),firstelem,nelem,(LONGLONG)nulval,
               (double)array,
               (double *)
               CONCAT17(in_stack_0000000f,
                        CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
               (int *)unaff_retaddr,anynul);
      }
      else {
        ffgpvd((fitsfile *)CONCAT44(datatype,in_stack_00000030),firstelem,nelem,(LONGLONG)nulval,
               (double)array,
               (double *)
               CONCAT17(in_stack_0000000f,
                        CONCAT16(in_stack_0000000e,CONCAT24(in_stack_0000000c,in_stack_00000008))),
               (int *)unaff_retaddr,anynul);
      }
    }
    else {
      *(undefined4 *)array = 0x19a;
    }
    local_4 = *array;
  }
  else {
    local_4 = *array;
  }
  return local_4;
}

Assistant:

int ffgpv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG firstelem,   /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgpvb(fptr, 1, firstelem, nelem, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgpvb(fptr, 1, firstelem, nelem, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgpvsb(fptr, 1, firstelem, nelem, 0,
               (signed char *) array, anynul, status);
      else
        ffgpvsb(fptr, 1, firstelem, nelem, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgpvui(fptr, 1, firstelem, nelem, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgpvui(fptr, 1, firstelem, nelem, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgpvi(fptr, 1, firstelem, nelem, 0,
               (short *) array, anynul, status);
      else
        ffgpvi(fptr, 1, firstelem, nelem, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgpvuk(fptr, 1, firstelem, nelem, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgpvuk(fptr, 1, firstelem, nelem, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgpvk(fptr, 1, firstelem, nelem, 0,
               (int *) array, anynul, status);
      else
        ffgpvk(fptr, 1, firstelem, nelem, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgpvuj(fptr, 1, firstelem, nelem, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgpvuj(fptr, 1, firstelem, nelem, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgpvj(fptr, 1, firstelem, nelem, 0,
               (long *) array, anynul, status);
      else
        ffgpvj(fptr, 1, firstelem, nelem, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgpvujj(fptr, 1, firstelem, nelem, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgpvujj(fptr, 1, firstelem, nelem, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgpvjj(fptr, 1, firstelem, nelem, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgpvjj(fptr, 1, firstelem, nelem, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgpve(fptr, 1, firstelem, nelem, 0,
               (float *) array, anynul, status);
      else
        ffgpve(fptr, 1, firstelem, nelem, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgpvd(fptr, 1, firstelem, nelem, 0,
               (double *) array, anynul, status);
      else
      {
        ffgpvd(fptr, 1, firstelem, nelem, *(double *) nulval,
               (double *) array, anynul, status);
      }
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}